

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O1

size_t bssl::ssl_ech_confirmation_signal_hello_offset(SSL *ssl)

{
  int iVar1;
  
  iVar1 = SSL_is_dtls(ssl);
  return (ulong)(iVar1 != 0) * 8 + 0x1e;
}

Assistant:

size_t ssl_ech_confirmation_signal_hello_offset(const SSL *ssl) {
  static_assert(ECH_CONFIRMATION_SIGNAL_LEN < SSL3_RANDOM_SIZE,
                "the confirmation signal is a suffix of the random");
  const size_t header_len =
      SSL_is_dtls(ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
  return header_len + 2 /* version */ + SSL3_RANDOM_SIZE -
         ECH_CONFIRMATION_SIGNAL_LEN;
}